

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O3

void WebPRescalerImportRowExpand_C(WebPRescaler *wrk,uint8_t *src)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  rescaler_t *prVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  rescaler_t *prVar14;
  uint uVar15;
  ulong uVar16;
  
  uVar1 = wrk->num_channels;
  lVar7 = (long)(int)uVar1;
  if (0 < lVar7) {
    iVar8 = wrk->dst_width * uVar1;
    iVar2 = wrk->x_add;
    iVar3 = wrk->src_width;
    prVar5 = wrk->frow;
    lVar13 = 0;
    uVar12 = uVar1;
    do {
      uVar16 = lVar13 + lVar7;
      uVar15 = (uint)src[lVar13];
      uVar11 = uVar15;
      if (1 < iVar3) {
        uVar11 = (uint)src[uVar16];
      }
      prVar5[lVar13] = iVar2 * (uint)src[lVar13];
      if ((int)uVar16 < iVar8) {
        prVar14 = prVar5 + uVar12;
        iVar4 = wrk->x_sub;
        iVar9 = iVar2;
        uVar10 = uVar12;
        do {
          iVar9 = iVar9 - iVar4;
          uVar6 = uVar11;
          if (iVar9 < 0) {
            uVar15 = (int)uVar16 + uVar1;
            uVar16 = (ulong)uVar15;
            iVar9 = iVar9 + iVar2;
            uVar6 = (uint)src[(int)uVar15];
            uVar15 = uVar11;
          }
          uVar11 = uVar6;
          *prVar14 = (uVar15 - uVar11) * iVar9 + uVar11 * iVar2;
          prVar14 = prVar14 + lVar7;
          uVar10 = uVar10 + uVar1;
        } while ((int)uVar10 < iVar8);
      }
      lVar13 = lVar13 + 1;
      uVar12 = uVar12 + 1;
    } while (lVar13 != lVar7);
  }
  return;
}

Assistant:

void WebPRescalerImportRowExpand_C(WebPRescaler* WEBP_RESTRICT const wrk,
                                   const uint8_t* WEBP_RESTRICT src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    // simple bilinear interpolation
    int accum = wrk->x_add;
    rescaler_t left = (rescaler_t)src[x_in];
    rescaler_t right =
        (wrk->src_width > 1) ? (rescaler_t)src[x_in + x_stride] : left;
    x_in += x_stride;
    while (1) {
      wrk->frow[x_out] = right * wrk->x_add + (left - right) * accum;
      x_out += x_stride;
      if (x_out >= x_out_max) break;
      accum -= wrk->x_sub;
      if (accum < 0) {
        left = right;
        x_in += x_stride;
        assert(x_in < wrk->src_width * x_stride);
        right = (rescaler_t)src[x_in];
        accum += wrk->x_add;
      }
    }
    assert(wrk->x_sub == 0 /* <- special case for src_width=1 */ || accum == 0);
  }
}